

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void continuous_dist_test_icdf<trng::logistic_dist<double>>(logistic_dist<double> *d)

{
  long lVar1;
  pointer pdVar2;
  ulong uVar3;
  int i;
  int iVar4;
  pointer pdVar5;
  double dVar6;
  vector<double,_std::allocator<double>_> p_values;
  double eps;
  AssertionHandler catchAssertionHandler;
  vector<double,_std::allocator<double>_> local_118;
  double local_f8;
  undefined8 uStack_f0;
  double local_e0;
  double local_d8;
  double local_d0;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  double *local_a8;
  char *local_a0;
  size_t sStack_98;
  double *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  local_d8 = 5.6843418860808015e-14;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_78.m_assertionInfo.macroName.m_start = (char *)0x3fe0000000000000;
  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
            (&local_118,(iterator)0x0,(double *)&local_78);
  iVar4 = 2;
  do {
    local_f8 = (double)iVar4;
    dVar6 = pow(*local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,local_f8);
    local_78.m_assertionInfo.macroName.m_start = (char *)(dVar6 + 0.0);
    if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_118,
                 (iterator)
                 local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_78);
    }
    else {
      *local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_78.m_assertionInfo.macroName.m_start;
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    dVar6 = pow(*local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,local_f8);
    local_78.m_assertionInfo.macroName.m_start = (char *)(1.0 - dVar6);
    if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_118,
                 (iterator)
                 local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)&local_78);
    }
    else {
      *local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_78.m_assertionInfo.macroName.m_start;
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    pdVar5 = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar2 = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x35);
  if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar3 = (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pdVar2,pdVar5);
  }
  pdVar2 = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pdVar5 = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_f8 = *pdVar5;
      local_e0 = trng::logistic_dist<double>::icdf(d,local_f8);
      dVar6 = exp((double)((ulong)((local_e0 - (d->P).eta_) / (d->P).theta_) | (ulong)DAT_002a2010))
      ;
      uVar3 = -(ulong)(local_e0 < (d->P).eta_);
      dVar6 = ABS((double)(~uVar3 & 0x3ff0000000000000 | uVar3 & (ulong)dVar6) / (dVar6 + 1.0) -
                  local_f8);
      if (5.6843418860808015e-14 <= dVar6) {
        uStack_f0 = 0;
        local_b8._vptr_ITransientExpression = (_func_int **)0x2a8487;
        local_b8.m_isBinaryExpression = true;
        local_b8.m_result = false;
        local_b8._10_6_ = 0;
        local_c8.file =
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
        ;
        local_c8.line = 0xa8;
        local_f8 = dVar6;
        Catch::StringRef::StringRef(&local_88,"std::abs(y - p) < eps");
        Catch::AssertionHandler::AssertionHandler
                  (&local_78,(StringRef *)&local_b8,&local_c8,local_88,Normal);
        local_d0 = local_f8;
        local_e0 = local_d8;
        Catch::StringRef::StringRef((StringRef *)&local_c8,"<");
        local_b8.m_result = local_f8 < local_e0;
        local_b8.m_isBinaryExpression = true;
        local_b8._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_0031a2f8;
        local_a8 = &local_d0;
        local_a0 = local_c8.file;
        sStack_98 = local_c8.line;
        local_90 = &local_d8;
        Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
        Catch::ITransientExpression::~ITransientExpression(&local_b8);
        Catch::AssertionHandler::complete(&local_78);
        if (local_78.m_completed == false) {
          (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_78.m_resultCapture,&local_78);
        }
      }
      pdVar5 = pdVar5 + 1;
    } while (pdVar5 != pdVar2);
  }
  if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}